

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erarules.cpp
# Opt level: O0

void __thiscall icu_63::EraRules::initCurrentEra(EraRules *this)

{
  int32_t iVar1;
  int *piVar2;
  int local_38;
  int eraIdx;
  int currentEncodedDate;
  int mid;
  int doy;
  int dow;
  int dom;
  int month0;
  int year;
  UDate now;
  EraRules *this_local;
  
  now = (UDate)this;
  _month0 = ucal_getNow_63();
  Grego::timeToFields(_month0,&dom,&dow,&doy,&mid,&currentEncodedDate,&eraIdx);
  iVar1 = encodeDate(dom,dow + 1,doy);
  local_38 = this->numEras;
  do {
    local_38 = local_38 + -1;
    if (local_38 < 1) break;
    piVar2 = LocalMemory<int>::operator[](&this->startDates,(long)local_38);
  } while (iVar1 < *piVar2);
  this->currentEra = local_38;
  return;
}

Assistant:

void EraRules::initCurrentEra() {
    UDate now = ucal_getNow();
    int year, month0, dom, dow, doy, mid;
    Grego::timeToFields(now, year, month0, dom, dow, doy, mid);
    int currentEncodedDate = encodeDate(year, month0 + 1 /* changes to 1-base */, dom);
    int eraIdx = numEras - 1;
    while (eraIdx > 0) {
        if (currentEncodedDate >= startDates[eraIdx]) {
            break;
        }
        eraIdx--;
    }
    // Note: current era could be before the first era.
    // In this case, this implementation returns the first era index (0).
    currentEra = eraIdx;}